

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O0

void __thiscall
Centaurus::CharClass<char>::collect_borders
          (CharClass<char> *this,set<char,_std::less<char>,_std::allocator<char>_> *dest)

{
  bool bVar1;
  pair<std::_Rb_tree_const_iterator<char>,_bool> pVar2;
  value_type_conflict2 local_51;
  _Base_ptr local_50;
  undefined1 local_48;
  value_type_conflict2 local_39;
  reference local_38;
  Range<char> *r;
  const_iterator __end0;
  const_iterator __begin0;
  vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_> *__range2;
  set<char,_std::less<char>,_std::allocator<char>_> *dest_local;
  CharClass<char> *this_local;
  
  __end0 = std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::begin
                     (&this->m_ranges);
  r = (Range<char> *)
      std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::end
                (&this->m_ranges);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_Centaurus::Range<char>_*,_std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>_>
                                *)&r);
    if (!bVar1) break;
    local_38 = __gnu_cxx::
               __normal_iterator<const_Centaurus::Range<char>_*,_std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>_>
               ::operator*(&__end0);
    local_39 = Range<char>::start(local_38);
    pVar2 = std::set<char,_std::less<char>,_std::allocator<char>_>::insert(dest,&local_39);
    local_50 = (_Base_ptr)pVar2.first._M_node;
    local_48 = pVar2.second;
    local_51 = Range<char>::end(local_38);
    std::set<char,_std::less<char>,_std::allocator<char>_>::insert(dest,&local_51);
    __gnu_cxx::
    __normal_iterator<const_Centaurus::Range<char>_*,_std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

void collect_borders(std::set<TCHAR>& dest) const
    {
        for (const auto& r : m_ranges)
        {
            dest.insert(r.start());
            dest.insert(r.end());
        }
    }